

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_ssl.cc
# Opt level: O1

int ssl_read(BIO *bio,char *out,int outl)

{
  SSL *ssl;
  int ret_code;
  int iVar1;
  
  ssl = (SSL *)bio->ptr;
  if (ssl == (SSL *)0x0) {
    return 0;
  }
  BIO_clear_retry_flags(bio);
  ret_code = SSL_read(ssl,out,outl);
  iVar1 = SSL_get_error(ssl,ret_code);
  switch(iVar1) {
  case 2:
    BIO_set_retry_read(bio);
    break;
  case 3:
    BIO_set_retry_write(bio);
    break;
  case 7:
    BIO_set_retry_special(bio);
    iVar1 = 2;
    goto LAB_0023ae8a;
  case 8:
    BIO_set_retry_special(bio);
    iVar1 = 3;
LAB_0023ae8a:
    BIO_set_retry_reason(bio,iVar1);
  }
  return ret_code;
}

Assistant:

static int ssl_read(BIO *bio, char *out, int outl) {
  SSL *ssl = get_ssl(bio);
  if (ssl == NULL) {
    return 0;
  }

  BIO_clear_retry_flags(bio);

  const int ret = SSL_read(ssl, out, outl);

  switch (SSL_get_error(ssl, ret)) {
    case SSL_ERROR_WANT_READ:
      BIO_set_retry_read(bio);
      break;

    case SSL_ERROR_WANT_WRITE:
      BIO_set_retry_write(bio);
      break;

    case SSL_ERROR_WANT_ACCEPT:
      BIO_set_retry_special(bio);
      BIO_set_retry_reason(bio, BIO_RR_ACCEPT);
      break;

    case SSL_ERROR_WANT_CONNECT:
      BIO_set_retry_special(bio);
      BIO_set_retry_reason(bio, BIO_RR_CONNECT);
      break;

    case SSL_ERROR_NONE:
    case SSL_ERROR_SYSCALL:
    case SSL_ERROR_SSL:
    case SSL_ERROR_ZERO_RETURN:
    default:
      break;
  }

  return ret;
}